

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_class.cpp
# Opt level: O0

void Omega_h::classify_equal_order(Mesh *mesh,Int ent_dim,LOs *eqv2v,Read<int> *eq_class_ids)

{
  Int IVar1;
  LO LVar2;
  Omega_h_Family family;
  Read<int> local_2b8;
  allocator local_2a1;
  string local_2a0 [32];
  Read<signed_char> local_280;
  allocator local_269;
  string local_268 [32];
  Read<int> local_248;
  Read<int> local_238;
  undefined1 local_228 [8];
  Read<int> class_id;
  Read<signed_char> local_208;
  undefined1 local_1f8 [8];
  Read<signed_char> class_dim;
  string local_1e0 [32];
  undefined1 local_1c0 [8];
  Read<signed_char> eq_class_dim;
  undefined1 local_1a8 [4];
  int neq;
  Read<int> local_198;
  Adj local_188;
  Read<int> local_158;
  Read<int> local_148;
  undefined1 local_138 [8];
  Adj v2e;
  LOs ev2v;
  Write<signed_char> codes;
  Write<int> eq2e_w;
  string local_d0 [32];
  Read<int> local_b0 [2];
  undefined1 local_90 [8];
  LOs eq2e;
  Read<int> *eq_class_ids_local;
  LOs *eqv2v_local;
  Int ent_dim_local;
  Mesh *mesh_local;
  ulong local_10;
  
  local_90 = (undefined1  [8])0x0;
  eq2e.write_.shared_alloc_.alloc = (Alloc *)0x0;
  eq2e.write_.shared_alloc_.direct_ptr = eq_class_ids;
  IVar1 = Mesh::dim(mesh);
  if (ent_dim == IVar1) {
    LVar2 = Mesh::nelems(mesh);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_d0,"",(allocator *)((long)&eq2e_w.shared_alloc_.direct_ptr + 7));
    Read<int>::Read(local_b0,LVar2,0,1,(string *)local_d0);
    Read<int>::operator=((Read<int> *)local_90,local_b0);
    Read<int>::~Read(local_b0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&eq2e_w.shared_alloc_.direct_ptr + 7));
  }
  else if (ent_dim == 0) {
    Read<int>::operator=((Read<int> *)local_90,eqv2v);
  }
  else {
    codes.shared_alloc_.direct_ptr = (void *)0x0;
    eq2e_w.shared_alloc_.alloc = (Alloc *)0x0;
    ev2v.write_.shared_alloc_.direct_ptr = (void *)0x0;
    codes.shared_alloc_.alloc = (Alloc *)0x0;
    Mesh::ask_verts_of((Mesh *)&v2e.codes.write_.shared_alloc_.direct_ptr,(Int)mesh);
    Mesh::ask_up((Adj *)local_138,mesh,0,ent_dim);
    family = Mesh::family(mesh);
    Read<int>::Read(&local_148,eqv2v);
    Read<int>::Read(&local_158,(Read<int> *)&v2e.codes.write_.shared_alloc_.direct_ptr);
    Adj::Adj(&local_188,(Adj *)local_138);
    find_matches(family,ent_dim,&local_148,&local_158,&local_188,
                 (Write<int> *)&codes.shared_alloc_.direct_ptr,
                 (Write<signed_char> *)&ev2v.write_.shared_alloc_.direct_ptr);
    Adj::~Adj(&local_188);
    Read<int>::~Read(&local_158);
    Read<int>::~Read(&local_148);
    Write<int>::Write((Write<int> *)local_1a8,(Write<int> *)&codes.shared_alloc_.direct_ptr);
    Read<int>::Read(&local_198,(Write<int> *)local_1a8);
    Read<int>::operator=((Read<int> *)local_90,&local_198);
    Read<int>::~Read(&local_198);
    Write<int>::~Write((Write<int> *)local_1a8);
    Adj::~Adj((Adj *)local_138);
    Read<int>::~Read((Read<int> *)&v2e.codes.write_.shared_alloc_.direct_ptr);
    Write<signed_char>::~Write((Write<signed_char> *)&ev2v.write_.shared_alloc_.direct_ptr);
    Write<int>::~Write((Write<int> *)&codes.shared_alloc_.direct_ptr);
  }
  if (((ulong)(eqv2v->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((eqv2v->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(eqv2v->write_).shared_alloc_.alloc >> 3;
  }
  LVar2 = (LO)((long)((ulong)(uint)((int)(local_10 >> 2) >> 0x1f) << 0x20 |
                     local_10 >> 2 & 0xffffffff) / (long)(ent_dim + 1));
  eqv2v_local._4_1_ = (char)ent_dim;
  eq_class_dim.write_.shared_alloc_.direct_ptr._4_4_ = LVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1e0,"",(allocator *)((long)&class_dim.write_.shared_alloc_.direct_ptr + 7));
  Read<signed_char>::Read
            ((Read<signed_char> *)local_1c0,LVar2,eqv2v_local._4_1_,(string *)local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&class_dim.write_.shared_alloc_.direct_ptr + 7));
  Read<signed_char>::Read(&local_208,(Read<signed_char> *)local_1c0);
  Read<int>::Read((Read<int> *)&class_id.write_.shared_alloc_.direct_ptr,(Read<int> *)local_90);
  LVar2 = Mesh::nents(mesh,ent_dim);
  IVar1 = Mesh::dim(mesh);
  map_onto<signed_char>
            ((Omega_h *)local_1f8,&local_208,(LOs *)&class_id.write_.shared_alloc_.direct_ptr,LVar2,
             (char)IVar1,1);
  Read<int>::~Read((Read<int> *)&class_id.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read(&local_208);
  Read<int>::Read(&local_238,eq_class_ids);
  Read<int>::Read(&local_248,(Read<int> *)local_90);
  LVar2 = Mesh::nents(mesh,ent_dim);
  map_onto<int>((Omega_h *)local_228,&local_238,&local_248,LVar2,-1,1);
  Read<int>::~Read(&local_248);
  Read<int>::~Read(&local_238);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"class_dim",&local_269);
  Read<signed_char>::Read(&local_280,(Read<signed_char> *)local_1f8);
  Mesh::add_tag<signed_char>(mesh,ent_dim,(string *)local_268,1,&local_280,false);
  Read<signed_char>::~Read(&local_280);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"class_id",&local_2a1);
  Read<int>::Read(&local_2b8,(Read<int> *)local_228);
  Mesh::add_tag<int>(mesh,ent_dim,(string *)local_2a0,1,&local_2b8,false);
  Read<int>::~Read(&local_2b8);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  Read<int>::~Read((Read<int> *)local_228);
  Read<signed_char>::~Read((Read<signed_char> *)local_1f8);
  Read<signed_char>::~Read((Read<signed_char> *)local_1c0);
  Read<int>::~Read((Read<int> *)local_90);
  return;
}

Assistant:

void classify_equal_order(
    Mesh* mesh, Int ent_dim, LOs eqv2v, Read<ClassId> eq_class_ids) {
  LOs eq2e;
  if (ent_dim == mesh->dim()) {
    /* assuming elements were constructed in the same order ! */
    eq2e = LOs(mesh->nelems(), 0, 1);
  } else if (ent_dim == VERT) {
    eq2e = eqv2v;
  } else {
    Write<LO> eq2e_w;
    Write<I8> codes;
    auto ev2v = mesh->ask_verts_of(ent_dim);
    auto v2e = mesh->ask_up(VERT, ent_dim);
    find_matches(mesh->family(), ent_dim, eqv2v, ev2v, v2e, &eq2e_w, &codes);
    eq2e = eq2e_w;
  }
  auto neq = eqv2v.size() / (ent_dim + 1);
  auto eq_class_dim = Read<I8>(neq, I8(ent_dim));
  auto class_dim =
      map_onto(eq_class_dim, eq2e, mesh->nents(ent_dim), I8(mesh->dim()), 1);
  auto class_id = map_onto(eq_class_ids, eq2e, mesh->nents(ent_dim), -1, 1);
  mesh->add_tag<I8>(ent_dim, "class_dim", 1, class_dim);
  mesh->add_tag<ClassId>(ent_dim, "class_id", 1, class_id);
}